

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConcaveCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtConvexTriangleCallback::processTriangle
          (cbtConvexTriangleCallback *this,cbtVector3 *triangle,int partId,int triangleIndex)

{
  float fVar1;
  cbtDispatcher *pcVar2;
  cbtManifoldResult *pcVar3;
  _func_int **pp_Var4;
  undefined1 auVar5 [16];
  ulong uVar6;
  cbtScalar *pcVar7;
  int iVar8;
  undefined4 extraout_var;
  long lVar10;
  cbtScalar *pcVar11;
  cbtPersistentManifold *pcVar12;
  cbtVector3 *p1;
  cbtCollisionObjectWrapper *pcVar13;
  CProfileSample __profile;
  cbtCollisionObjectWrapper triObWrap;
  cbtTriangleShape tm;
  CProfileSample local_e1;
  cbtDispatcher *local_e0;
  cbtCollisionObjectWrapper local_d8;
  cbtPolyhedralConvexShape local_b0;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  long *plVar9;
  
  CProfileSample::CProfileSample(&local_e1,"cbtConvexTriangleCallback::processTriangle");
  auVar5 = vminss_avx(ZEXT416((uint)triangle->m_floats[0]),ZEXT416((uint)triangle[1].m_floats[0]));
  auVar5 = vminss_avx(auVar5,ZEXT416((uint)triangle[2].m_floats[0]));
  if (auVar5._0_4_ <= (this->m_aabbMax).m_floats[0]) {
    uVar6 = (ulong)(triangle->m_floats[0] <= triangle[1].m_floats[0]);
    lVar10 = 0x20;
    if (triangle[2].m_floats[0] < triangle[uVar6].m_floats[0]) {
      lVar10 = uVar6 * 0x10;
    }
    if ((this->m_aabbMin).m_floats[0] <= *(float *)((long)triangle->m_floats + lVar10)) {
      auVar5 = vminss_avx(ZEXT416((uint)triangle->m_floats[2]),
                          ZEXT416((uint)triangle[1].m_floats[2]));
      auVar5 = vminss_avx(auVar5,ZEXT416((uint)triangle[2].m_floats[2]));
      if (auVar5._0_4_ <= (this->m_aabbMax).m_floats[2]) {
        pcVar7 = triangle[1].m_floats;
        if (triangle[1].m_floats[2] < triangle->m_floats[2]) {
          pcVar7 = triangle->m_floats;
        }
        pcVar11 = pcVar7 + 2;
        if (pcVar7[2] <= triangle[2].m_floats[2]) {
          pcVar11 = triangle[2].m_floats + 2;
        }
        if ((this->m_aabbMin).m_floats[2] <= *pcVar11) {
          auVar5 = vminss_avx(ZEXT416((uint)triangle->m_floats[1]),
                              ZEXT416((uint)triangle[1].m_floats[1]));
          auVar5 = vminss_avx(auVar5,ZEXT416((uint)triangle[2].m_floats[1]));
          if (auVar5._0_4_ <= (this->m_aabbMax).m_floats[1]) {
            pcVar7 = triangle[1].m_floats;
            if (triangle[1].m_floats[1] < triangle->m_floats[1]) {
              pcVar7 = triangle->m_floats;
            }
            pcVar11 = pcVar7 + 1;
            if (pcVar7[1] <= triangle[2].m_floats[1]) {
              pcVar11 = triangle[2].m_floats + 1;
            }
            if (((this->m_aabbMin).m_floats[1] <= *pcVar11) &&
               (this->m_convexBodyWrap->m_shape->m_shapeType < 0x18)) {
              pcVar2 = this->m_dispatcher;
              cbtPolyhedralConvexShape::cbtPolyhedralConvexShape(&local_b0);
              local_b0.super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
              _vptr_cbtCollisionShape = (_func_int **)&PTR__cbtPolyhedralConvexShape_00b70638;
              local_b0.super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
              m_shapeType = 1;
              local_60 = *(undefined8 *)triangle->m_floats;
              uStack_58 = *(undefined8 *)(triangle->m_floats + 2);
              local_50 = *(undefined8 *)triangle[1].m_floats;
              uStack_48 = *(undefined8 *)(triangle[1].m_floats + 2);
              local_40 = *(undefined8 *)triangle[2].m_floats;
              uStack_38 = *(undefined8 *)(triangle[2].m_floats + 2);
              local_b0.super_cbtConvexInternalShape.m_collisionMargin =
                   this->m_collisionMarginTriangle;
              local_d8.m_parent = this->m_triBodyWrap;
              local_d8.m_collisionObject = (local_d8.m_parent)->m_collisionObject;
              local_d8.m_worldTransform = (local_d8.m_parent)->m_worldTransform;
              fVar1 = this->m_resultOut->m_closestPointDistanceThreshold;
              if (0.0 < fVar1) {
                pcVar12 = (cbtPersistentManifold *)0x0;
              }
              else {
                pcVar12 = this->m_manifoldPtr;
              }
              local_e0 = pcVar2;
              local_d8.m_shape = (cbtCollisionShape *)&local_b0;
              local_d8.m_partId = partId;
              local_d8.m_index = triangleIndex;
              iVar8 = (*pcVar2->_vptr_cbtDispatcher[2])
                                (pcVar2,this->m_convexBodyWrap,&local_d8,pcVar12,
                                 (ulong)((0.0 < fVar1) + 1));
              plVar9 = (long *)CONCAT44(extraout_var,iVar8);
              pcVar3 = this->m_resultOut;
              pcVar13 = pcVar3->m_body0Wrap;
              if (pcVar13->m_collisionObject == this->m_triBodyWrap->m_collisionObject) {
                pcVar3->m_body0Wrap = &local_d8;
                (*(pcVar3->super_Result)._vptr_Result[2])
                          (pcVar3,(ulong)(uint)partId,(ulong)(uint)triangleIndex);
              }
              else {
                pp_Var4 = (pcVar3->super_Result)._vptr_Result;
                pcVar13 = pcVar3->m_body1Wrap;
                pcVar3->m_body1Wrap = &local_d8;
                (*pp_Var4[3])(pcVar3,(ulong)(uint)partId,(ulong)(uint)triangleIndex);
              }
              (**(code **)(*plVar9 + 0x10))
                        (plVar9,this->m_convexBodyWrap,&local_d8,this->m_dispatchInfoPtr,
                         this->m_resultOut);
              (&this->m_resultOut->m_body0Wrap)
              [this->m_resultOut->m_body0Wrap->m_collisionObject !=
               this->m_triBodyWrap->m_collisionObject] = pcVar13;
              (**(code **)*plVar9)(plVar9);
              (*local_e0->_vptr_cbtDispatcher[0xf])(local_e0,plVar9);
              cbtPolyhedralConvexShape::~cbtPolyhedralConvexShape(&local_b0);
            }
          }
        }
      }
    }
  }
  CProfileSample::~CProfileSample(&local_e1);
  return;
}

Assistant:

void cbtConvexTriangleCallback::processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
{
	BT_PROFILE("cbtConvexTriangleCallback::processTriangle");

	if (!TestTriangleAgainstAabb2(triangle, m_aabbMin, m_aabbMax))
	{
		return;
	}

	//just for debugging purposes
	//printf("triangle %d",m_triangleCount++);

	cbtCollisionAlgorithmConstructionInfo ci;
	ci.m_dispatcher1 = m_dispatcher;

#if 0	
	
	///debug drawing of the overlapping triangles
	if (m_dispatchInfoPtr && m_dispatchInfoPtr->m_debugDraw && (m_dispatchInfoPtr->m_debugDraw->getDebugMode() &cbtIDebugDraw::DBG_DrawWireframe ))
	{
		const cbtCollisionObject* ob = const_cast<cbtCollisionObject*>(m_triBodyWrap->getCollisionObject());
		cbtVector3 color(1,1,0);
		cbtTransform& tr = ob->getWorldTransform();
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[0]),tr(triangle[1]),color);
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[1]),tr(triangle[2]),color);
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[2]),tr(triangle[0]),color);
	}
#endif

	if (m_convexBodyWrap->getCollisionShape()->isConvex())
	{
		cbtTriangleShape tm(triangle[0], triangle[1], triangle[2]);
		tm.setMargin(m_collisionMarginTriangle);

		cbtCollisionObjectWrapper triObWrap(m_triBodyWrap, &tm, m_triBodyWrap->getCollisionObject(), m_triBodyWrap->getWorldTransform(), partId, triangleIndex);  //correct transform?
		cbtCollisionAlgorithm* colAlgo = 0;

		if (m_resultOut->m_closestPointDistanceThreshold > 0)
		{
			colAlgo = ci.m_dispatcher1->findAlgorithm(m_convexBodyWrap, &triObWrap, 0, BT_CLOSEST_POINT_ALGORITHMS);
		}
		else
		{
			colAlgo = ci.m_dispatcher1->findAlgorithm(m_convexBodyWrap, &triObWrap, m_manifoldPtr, BT_CONTACT_POINT_ALGORITHMS);
		}
		const cbtCollisionObjectWrapper* tmpWrap = 0;

		if (m_resultOut->getBody0Internal() == m_triBodyWrap->getCollisionObject())
		{
			tmpWrap = m_resultOut->getBody0Wrap();
			m_resultOut->setBody0Wrap(&triObWrap);
			m_resultOut->setShapeIdentifiersA(partId, triangleIndex);
		}
		else
		{
			tmpWrap = m_resultOut->getBody1Wrap();
			m_resultOut->setBody1Wrap(&triObWrap);
			m_resultOut->setShapeIdentifiersB(partId, triangleIndex);
		}

		colAlgo->processCollision(m_convexBodyWrap, &triObWrap, *m_dispatchInfoPtr, m_resultOut);

		if (m_resultOut->getBody0Internal() == m_triBodyWrap->getCollisionObject())
		{
			m_resultOut->setBody0Wrap(tmpWrap);
		}
		else
		{
			m_resultOut->setBody1Wrap(tmpWrap);
		}

		colAlgo->~cbtCollisionAlgorithm();
		ci.m_dispatcher1->freeCollisionAlgorithm(colAlgo);
	}
}